

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

prf_model_t * prf_model_create(void)

{
  prf_model_t *model_00;
  prf_model_t *model;
  
  model_00 = (prf_model_t *)malloc(0x28);
  if (model_00 == (prf_model_t *)0x0) {
    prf_error(9,"memory allocation error (returned NULL)");
  }
  prf_model_clear(model_00);
  return model_00;
}

Assistant:

prf_model_t *
prf_model_create(
    void )
{
    prf_model_t * model;
    model = (prf_model_t *)malloc( sizeof( prf_model_t ) );
    if ( model == NULL )
        prf_error( 9, "memory allocation error (returned NULL)" );
    prf_model_clear( model );
    return model;
}